

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__math
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  uint uVar1;
  ParserChar *text;
  size_t sVar2;
  bool bVar3;
  math__AttributeData *pmVar4;
  StringHash SVar5;
  char **ppcVar6;
  ENUM__mathml__overflow EVar7;
  ENUM__mathml__display EVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  xmlChar **ppxVar12;
  StringHashPair SVar13;
  bool failed;
  ParserChar *attributeValue;
  bool failed_2;
  bool local_141;
  ParserChar *local_140;
  StackMemoryManager *local_138;
  URI *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  URI *local_120;
  URI local_118;
  
  pmVar4 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::math__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar12 = attributes->attributes;
  if (ppxVar12 != (xmlChar **)0x0) {
    local_120 = &pmVar4->href;
    local_128 = &pmVar4->_class;
    local_130 = &pmVar4->altimg;
    local_138 = &(this->
                 super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                 ).super_ParserTemplateBase.mStackMemoryManager;
    do {
      text = *ppxVar12;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar5 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_140 = ppxVar12[1];
        if ((long)SVar5 < 0x7f4353) {
          if ((long)SVar5 < 0x7f8b6) {
            if ((long)SVar5 < 0x74835) {
              if (SVar5 == 0x6f4) {
                pmVar4->id = local_140;
              }
              else {
                if (SVar5 == 0x6f8b6) {
                  GeneratedSaxParser::Utils::toURI(&local_118,&local_140,&local_141);
                  COLLADABU::URI::operator=(local_120,&local_118);
                  COLLADABU::URI::~URI(&local_118);
                  if ((local_141 != true) ||
                     (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                         ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,0x6f8b6,local_140),
                     !bVar3)) {
                    validationDataPtr = (void **)0x4;
                    bVar3 = true;
                    if (local_141 == false) {
                      *(byte *)&pmVar4->present_attributes = (byte)pmVar4->present_attributes | 4;
                    }
                    goto LAB_00750122;
                  }
LAB_00750113:
                  bVar3 = false;
                  validationDataPtr = (void **)0x1;
                  goto LAB_00750122;
                }
LAB_00750130:
                SVar13 = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(text);
                if (SVar13.first != 0x7f4353) {
                  if ((pmVar4->unknownAttributes).data == (char **)0x0) {
                    ppcVar6 = (char **)GeneratedSaxParser::StackMemoryManager::newObject
                                                 (local_138,0x10);
                  }
                  else {
                    ppcVar6 = (char **)GeneratedSaxParser::StackMemoryManager::growObject
                                                 (local_138,0x10);
                  }
                  (pmVar4->unknownAttributes).data = ppcVar6;
                  sVar2 = (pmVar4->unknownAttributes).size;
                  ppcVar6[sVar2] = text;
                  (pmVar4->unknownAttributes).data[sVar2 + 1] = local_140;
                  (pmVar4->unknownAttributes).size = sVar2 + 2;
                }
              }
            }
            else if (SVar5 == 0x74835) {
              pmVar4->name = local_140;
            }
            else {
              if (SVar5 != 0x7c065) goto LAB_00750130;
              pmVar4->type = local_140;
            }
          }
          else if ((long)SVar5 < 0x7ac025) {
            if (SVar5 == 0x7f8b6) {
              pmVar4->xref = local_140;
            }
            else {
              if (SVar5 != 0x6a28a3) goto LAB_00750130;
              bVar3 = GeneratedSaxParser::
                      ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                      ::
                      characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                                (&this->
                                  super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                                 ,local_140,local_128);
              if (bVar3) {
                *(byte *)&pmVar4->present_attributes = (byte)pmVar4->present_attributes | 2;
                validationDataPtr = (void **)0x4;
                bVar3 = true;
              }
              else {
                bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,0x6a28a3,local_140);
                bVar3 = !bVar3;
                validationDataPtr = (void **)(ulong)((uint)bVar3 + (uint)bVar3 * 2 + 1);
              }
              if (!bVar3) goto LAB_007501cd;
            }
          }
          else if (SVar5 == 0x7ac025) {
            pmVar4->style = local_140;
          }
          else {
            if (SVar5 != 0x7dfba8) goto LAB_00750130;
            pmVar4->width = local_140;
          }
LAB_007501cb:
          validationDataPtr = (void **)0x0;
        }
        else {
          if ((long)SVar5 < 0x83bac94) {
            if ((long)SVar5 < 0x6ebfdf4) {
              if (SVar5 != 0x7f4353) {
                if (SVar5 != 0x683b037) goto LAB_00750130;
                GeneratedSaxParser::Utils::toURI(&local_118,&local_140,&local_141);
                COLLADABU::URI::operator=(local_130,&local_118);
                COLLADABU::URI::~URI(&local_118);
                if ((local_141 == true) &&
                   (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                       ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,0x683b037,local_140),
                   bVar3)) goto LAB_00750113;
                validationDataPtr = (void **)0x4;
                bVar3 = true;
                if (local_141 == false) {
                  *(byte *)&pmVar4->present_attributes = (byte)pmVar4->present_attributes | 1;
                }
                goto LAB_00750122;
              }
            }
            else if (SVar5 == 0x6ebfdf4) {
              pmVar4->height = local_140;
            }
            else {
              if (SVar5 != 0x737a963) goto LAB_00750130;
              pmVar4->macros = local_140;
            }
            goto LAB_007501cb;
          }
          if ((long)SVar5 < 0xb0a72e9) {
            if (SVar5 == 0x83bac94) {
              pmVar4->alttext = local_140;
            }
            else {
              if (SVar5 != 0x89c2ac5) goto LAB_00750130;
              pmVar4->baseline = local_140;
            }
            goto LAB_007501cb;
          }
          if (SVar5 == 0xb0a72e9) {
            SVar5 = GeneratedSaxParser::Utils::calculateStringHash(local_140,(bool *)&local_118);
            lVar9 = 0;
            bVar3 = false;
            do {
              if (*(StringHash *)((long)&ENUM__mathml__displayMap + lVar9) == SVar5) {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                validationDataPtr = (void **)(ulong)*(uint *)((long)&DAT_0085b3f8 + lVar9);
              }
              EVar8 = (ENUM__mathml__display)validationDataPtr;
              if (*(StringHash *)((long)&ENUM__mathml__displayMap + lVar9) == SVar5) break;
              lVar9 = lVar9 + 0x10;
              bVar3 = lVar9 != 0x10;
            } while (lVar9 == 0x10);
            if (bVar3) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
              EVar8 = ENUM__mathml__display__COUNT;
            }
            pmVar4->display = EVar8;
            if ((char)local_118.mUriString._M_dataplus._M_p == '\x01') {
              SVar5 = 0xb0a72e9;
LAB_00750100:
              bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x738a8,SVar5,local_140);
              if (bVar3) goto LAB_00750113;
            }
          }
          else {
            if (SVar5 != 0xcc8d607) goto LAB_00750130;
            SVar5 = GeneratedSaxParser::Utils::calculateStringHash(local_140,(bool *)&local_118);
            bVar3 = false;
            uVar11 = 0;
            puVar10 = &DAT_0085b3b8;
            do {
              if (*(StringHash *)(puVar10 + -2) == SVar5) {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                validationDataPtr = (void **)(ulong)*puVar10;
              }
              EVar7 = (ENUM__mathml__overflow)validationDataPtr;
              if (*(StringHash *)(puVar10 + -2) == SVar5) break;
              bVar3 = 2 < uVar11;
              uVar11 = uVar11 + 1;
              puVar10 = puVar10 + 4;
            } while (uVar11 != 4);
            if (bVar3) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
              EVar7 = ENUM__mathml__overflow__COUNT;
            }
            pmVar4->overflow = EVar7;
            if ((char)local_118.mUriString._M_dataplus._M_p == '\x01') {
              SVar5 = 0xcc8d607;
              goto LAB_00750100;
            }
          }
          validationDataPtr = (void **)0x4;
          bVar3 = true;
LAB_00750122:
          if (bVar3) goto LAB_007501cb;
        }
LAB_007501cd:
        ppxVar12 = ppxVar12 + 2;
      }
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((pmVar4->present_attributes & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pmVar4->altimg,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  uVar1 = pmVar4->present_attributes;
  if ((uVar1 & 2) == 0) {
    (pmVar4->_class).data = (ParserString *)0x0;
    (pmVar4->_class).size = 0;
  }
  if ((uVar1 & 4) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pmVar4->href,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__math( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__math( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

math__AttributeData* attributeData = newData<math__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_BASELINE:
    {

attributeData->baseline = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_OVERFLOW:
    {
bool failed;
attributeData->overflow = Utils::toEnum<ENUM__mathml__overflow, StringHash, ENUM__mathml__overflow__COUNT>(attributeValue, failed, ENUM__mathml__overflowMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_OVERFLOW,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ALTIMG:
    {
bool failed;
attributeData->altimg = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_ALTIMG,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE_ALTIMG_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_ALTTEXT:
    {

attributeData->alttext = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HEIGHT:
    {

attributeData->height = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_WIDTH:
    {

attributeData->width = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_MACROS:
    {

attributeData->macros = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DISPLAY:
    {
bool failed;
attributeData->display = Utils::toEnum<ENUM__mathml__display, StringHash, ENUM__mathml__display__COUNT>(attributeValue, failed, ENUM__mathml__displayMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_DISPLAY,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_MATH, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MATH,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_XMLNS:
    {
    // ignore

    break;
    }
    default:
    {
        StringHashPair hashPair = Utils::calculateStringHashWithNamespace( attribute );
        if ( hashPair.first != HASH_ATTRIBUTE_XMLNS )
        {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;
        }
        else
        {
            // ignore
        }

    }
    }
    }
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE_ALTIMG_PRESENT) == 0)
{
    attributeData->altimg = COLLADABU::URI("");
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}